

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HMPSIO.cpp
# Opt level: O0

bool load_mpsLine(FILE *file,int *integerVar,int lmax,char *line,char *flag,double *data)

{
  int iVar1;
  int iVar2;
  char *pcVar3;
  size_t sVar4;
  char *in_RCX;
  int in_EDX;
  undefined4 *in_RSI;
  FILE *in_RDI;
  char *in_R8;
  double *in_R9;
  double dVar5;
  int cnter;
  int lcnt;
  char *fgets_rt;
  int F6;
  int F5;
  int F4;
  int F3;
  int F2;
  int F1;
  char local_62;
  int local_60;
  int local_5c;
  bool local_1;
  
  if (in_R8[1] == '\0') {
    while (pcVar3 = fgets(in_RCX,in_EDX,in_RDI), pcVar3 != (char *)0x0) {
      sVar4 = strlen(in_RCX);
      local_5c = (int)sVar4;
      do {
        iVar1 = local_5c;
        local_5c = iVar1 + -1;
        iVar2 = isspace((int)in_RCX[local_5c]);
      } while (iVar2 != 0 && -1 < local_5c);
      if ((0 < local_5c) && (local_5c = iVar1, *in_RCX != '*')) {
        while (local_5c < 0x18) {
          in_RCX[local_5c] = ' ';
          local_5c = local_5c + 1;
        }
        if (local_5c == 0x18) {
          local_5c = 0x19;
          in_RCX[0x18] = '0';
        }
        in_RCX[local_5c] = '\0';
        if (*in_RCX != ' ') {
          *in_R8 = *in_RCX;
          return false;
        }
        if (((((in_RCX[0xe] != '\'') || (in_RCX[0xf] != 'M')) || (in_RCX[0x10] != 'A')) ||
            ((in_RCX[0x11] != 'R' || (in_RCX[0x12] != 'K')))) ||
           ((in_RCX[0x13] != 'E' || (in_RCX[0x14] != 'R')))) {
          if (in_RCX[2] == ' ') {
            local_62 = in_RCX[1];
          }
          else {
            local_62 = in_RCX[2];
          }
          *in_R8 = local_62;
          in_R9[1] = *(double *)(in_RCX + 4);
          in_R9[2] = *(double *)(in_RCX + 0xe);
          dVar5 = atof(in_RCX + 0x18);
          *in_R9 = dVar5;
          if (0x27 < local_5c) {
            in_R8[1] = '\x01';
          }
          return true;
        }
        for (local_60 = (int)in_RCX[0x16]; in_RCX[local_60] != '\''; local_60 = local_60 + 1) {
        }
        if (((in_RCX[local_60 + 1] == 'I') && (in_RCX[local_60 + 2] == 'N')) &&
           ((in_RCX[local_60 + 3] == 'T' &&
            (((in_RCX[local_60 + 4] == 'O' && (in_RCX[local_60 + 5] == 'R')) &&
             (in_RCX[local_60 + 6] == 'G')))))) {
          *in_RSI = 1;
        }
        else if (((in_RCX[local_60 + 1] == 'I') && (in_RCX[local_60 + 2] == 'N')) &&
                ((in_RCX[local_60 + 3] == 'T' &&
                 (((in_RCX[local_60 + 4] == 'E' && (in_RCX[local_60 + 5] == 'N')) &&
                  (in_RCX[local_60 + 6] == 'D')))))) {
          *in_RSI = 0;
        }
      }
    }
    printf("load_mpsLine: fgets_rt = %s\n",0);
    local_1 = false;
  }
  else {
    in_R8[1] = '\0';
    in_R9[2] = *(double *)(in_RCX + 0x27);
    dVar5 = atof(in_RCX + 0x31);
    *in_R9 = dVar5;
    local_1 = true;
  }
  return local_1;
}

Assistant:

bool load_mpsLine(FILE *file, int& integerVar, int lmax, char *line, char *flag, double *data) {
    int F1 = 1, F2 = 4, F3 = 14, F4 = 24, F5 = 39, F6 = 49;
    char *fgets_rt;

    // check the buffer
    if (flag[1]) {
        flag[1] = 0;
        memcpy(&data[2], &line[F5], 8);
        data[0] = atof(&line[F6]);
        return true;
    }

    // try to read some to the line
    for (;;) {
        // Line input
        fgets_rt = fgets(line, lmax, file);
	if (fgets_rt == NULL) {
	  printf("load_mpsLine: fgets_rt = %s\n", fgets_rt);
	  return false;
	}
        // Line trim   -- to delete tailing white spaces
        int lcnt = strlen(line) - 1;
        while (isspace(line[lcnt]) && lcnt >= 0)
            lcnt--;
        if (lcnt <= 0 || line[0] == '*')
            continue;

        // Line expand -- to get data easier
        lcnt++;
        while (lcnt < F4)
            line[lcnt++] = ' '; // For row and bound row name
        if (lcnt == F4)
            line[lcnt++] = '0'; // For bound value
        line[lcnt] = '\0';

        // Done with section symbol
        if (line[0] != ' ') {
            flag[0] = line[0];
            return false;
        }

        if (line[F3] == '\'') {
	  if (line[F3+1] == 'M' && line[F3+2] == 'A' && line[F3+3] == 'R' &&
	      line[F3+4] == 'K' && line[F3+5] == 'E' && line[F3+6] == 'R') {
	    int cnter = line[F3+8];
	    while (line[cnter] != '\'')
	      ++cnter;
	    if (line[cnter+1] == 'I' && line[cnter+2] == 'N' && line[cnter+3] == 'T' &&
		line[cnter+4] == 'O' && line[cnter+5] == 'R' && line[cnter+6] == 'G')
	      integerVar = 1;
	    else if (line[cnter+1] == 'I' && line[cnter+2] == 'N' && line[cnter+3] == 'T' &&
		     line[cnter+4] == 'E' && line[cnter+5] == 'N' && line[cnter+6] == 'D')
	      integerVar = 0;
	    continue;
	  }
        }

        // Read major symbol & name
	flag[0] = line[F1 + 1] == ' ' ? line[F1] : line[F1 + 1];
	memcpy(&data[1], &line[F2], 8);
        // Read 1st minor name & value to output
        memcpy(&data[2], &line[F3], 8);
        data[0] = atof(&line[F4]);

        // Keep 2nd minor name & value for future
        if (lcnt > F5)
            flag[1] = 1;
        break;
    }

    return true;
}